

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControl::moveCursor(QWidgetTextControl *this,MoveOperation op,MoveMode mode)

{
  QWidgetTextControlPrivate *this_00;
  char cVar1;
  long in_FS_OFFSET;
  QTextCursor oldSelection;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)&local_40,&this_00->cursor);
  cVar1 = QTextCursor::movePosition((MoveOperation)&this_00->cursor,op,mode);
  QWidgetTextControlPrivate::updateCurrentCharFormat(this_00);
  QWidgetTextControlPrivate::selectionChanged(this_00,false);
  (**(code **)(*(long *)this + 0x60))(this);
  QWidgetTextControlPrivate::repaintOldAndNewSelection(this_00,(QTextCursor *)&local_40);
  if (cVar1 != '\0') {
    QMetaObject::activate((QObject *)this,&staticMetaObject,6,(void **)0x0);
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::moveCursor(QTextCursor::MoveOperation op, QTextCursor::MoveMode mode)
{
    Q_D(QWidgetTextControl);
    const QTextCursor oldSelection = d->cursor;
    const bool moved = d->cursor.movePosition(op, mode);
    d->_q_updateCurrentCharFormatAndSelection();
    ensureCursorVisible();
    d->repaintOldAndNewSelection(oldSelection);
    if (moved)
        emit cursorPositionChanged();
}